

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompAndExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  xmlChar *pxVar1;
  byte *pbVar2;
  
  xmlXPathCompEqualityExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar2 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar2 + 1;
      pbVar2 = pbVar2 + 1;
    }
    while ((pxVar1 = ctxt->cur, *pxVar1 == 'a' && ((pxVar1[1] == 'n' && (pxVar1[2] == 'd'))))) {
      ch1 = ctxt->comp->last;
      pbVar2 = pxVar1 + 3;
      while( true ) {
        ctxt->cur = pbVar2;
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        pbVar2 = pbVar2 + 1;
      }
      xmlXPathCompEqualityExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_AND,0,0,0,(void *)0x0,(void *)0x0);
      pbVar2 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar2 + 1;
        pbVar2 = pbVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompAndExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompEqualityExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == 'a') && (NXT(1) == 'n') && (NXT(2) == 'd')) {
	int op1 = ctxt->comp->last;
        SKIP(3);
	SKIP_BLANKS;
        xmlXPathCompEqualityExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_AND, op1, ctxt->comp->last, 0, 0);
	SKIP_BLANKS;
    }
}